

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O1

shared_ptr<cmDebugger::cmDebuggerStackFrame> __thiscall
cmDebugger::cmDebuggerThread::GetStackFrame(cmDebuggerThread *this,int64_t frameId)

{
  long *plVar1;
  pointer pcVar2;
  long lVar3;
  ulong in_RDX;
  ulong uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar5;
  long *plVar6;
  __hash_code __code;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> sVar7;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = (mutex_type *)(frameId + 0x78);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  uVar4 = in_RDX % *(ulong *)(frameId + 0x48);
  plVar5 = *(long **)(*(long *)(frameId + 0x40) + uVar4 * 8);
  plVar6 = (long *)0x0;
  if ((plVar5 != (long *)0x0) &&
     (plVar1 = (long *)*plVar5, plVar6 = plVar5, ((long *)*plVar5)[1] != in_RDX)) {
    while (plVar5 = plVar1, plVar1 = (long *)*plVar5, plVar1 != (long *)0x0) {
      plVar6 = (long *)0x0;
      if (((ulong)plVar1[1] % *(ulong *)(frameId + 0x48) != uVar4) ||
         (plVar6 = plVar5, plVar1[1] == in_RDX)) goto LAB_003a6caf;
    }
    plVar6 = (long *)0x0;
  }
LAB_003a6caf:
  if (plVar6 == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = *plVar6;
  }
  if (lVar3 == 0) {
    this->Id = 0;
    (this->Name)._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    this->Id = *(int64_t *)(lVar3 + 0x10);
    pcVar2 = *(pointer *)(lVar3 + 0x18);
    (this->Name)._M_dataplus._M_p = pcVar2;
    if (pcVar2 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  sVar7.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar7.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerStackFrame>)
         sVar7.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerStackFrame> cmDebuggerThread::GetStackFrame(
  int64_t frameId)
{
  std::unique_lock<std::mutex> lock(Mutex);
  auto it = FrameMap.find(frameId);

  if (it == FrameMap.end()) {
    return {};
  }

  return it->second;
}